

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

bool vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::comparePrimitivesExact
               (PerPrimitive *primitivesA,PerPrimitive *primitivesB,int numPrimitivesPerPatch)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  int i;
  int iVar12;
  ulong uVar13;
  float *pfVar14;
  bool local_59;
  
  local_59 = numPrimitivesPerPatch < 1;
  if (0 < numPrimitivesPerPatch) {
    pfVar11 = primitivesA->tessCoord[0].m_data + 1;
    pfVar9 = primitivesA->tessCoord[1].m_data + 1;
    pfVar14 = primitivesA->tessCoord[2].m_data + 1;
    uVar13 = 0;
    iVar8 = 0;
    do {
      fVar2 = primitivesA[uVar13].tessCoord[0].m_data[0];
      iVar12 = 0;
      bVar5 = false;
      iVar7 = iVar8;
      do {
        iVar8 = (iVar7 + 1) % numPrimitivesPerPatch;
        if ((fVar2 != primitivesB[iVar7].tessCoord[0].m_data[0]) ||
           (NAN(fVar2) || NAN(primitivesB[iVar7].tessCoord[0].m_data[0]))) {
LAB_00794499:
          bVar4 = true;
        }
        else {
          uVar6 = 0;
          while (uVar10 = uVar6, uVar10 != 3) {
            pfVar1 = primitivesB[iVar7].tessCoord[0].m_data + uVar10 + 1;
            if ((pfVar11[uVar10] != *pfVar1) ||
               (uVar6 = uVar10 + 1, NAN(pfVar11[uVar10]) || NAN(*pfVar1))) break;
          }
          if ((uVar10 < 3) ||
             ((fVar3 = primitivesA[uVar13].tessCoord[1].m_data[0],
              fVar3 != primitivesB[iVar7].tessCoord[1].m_data[0] ||
              (NAN(fVar3) || NAN(primitivesB[iVar7].tessCoord[1].m_data[0]))))) goto LAB_00794499;
          uVar6 = 0;
          while (uVar10 = uVar6, uVar10 != 3) {
            pfVar1 = primitivesB[iVar7].tessCoord[1].m_data + uVar10 + 1;
            if ((pfVar9[uVar10] != *pfVar1) ||
               (uVar6 = uVar10 + 1, NAN(pfVar9[uVar10]) || NAN(*pfVar1))) break;
          }
          if ((uVar10 < 3) ||
             ((fVar3 = primitivesA[uVar13].tessCoord[2].m_data[0],
              fVar3 != primitivesB[iVar7].tessCoord[2].m_data[0] ||
              (NAN(fVar3) || NAN(primitivesB[iVar7].tessCoord[2].m_data[0]))))) goto LAB_00794499;
          uVar6 = 0;
          while (uVar10 = uVar6, uVar10 != 3) {
            pfVar1 = primitivesB[iVar7].tessCoord[2].m_data + uVar10 + 1;
            if ((pfVar14[uVar10] != *pfVar1) ||
               (uVar6 = uVar10 + 1, NAN(pfVar14[uVar10]) || NAN(*pfVar1))) break;
          }
          if (uVar10 < 3) goto LAB_00794499;
          bVar5 = true;
          bVar4 = false;
        }
      } while ((bVar4) && (iVar12 = iVar12 + 1, iVar7 = iVar8, iVar12 < numPrimitivesPerPatch));
      if (!bVar5) {
        return local_59;
      }
      uVar13 = uVar13 + 1;
      local_59 = (uint)numPrimitivesPerPatch <= uVar13;
      pfVar11 = pfVar11 + 0x10;
      pfVar9 = pfVar9 + 0x10;
      pfVar14 = pfVar14 + 0x10;
    } while (uVar13 != (uint)numPrimitivesPerPatch);
  }
  return local_59;
}

Assistant:

bool comparePrimitivesExact (const PerPrimitive* const primitivesA, const PerPrimitive* const primitivesB, const int numPrimitivesPerPatch)
{
	int ndxB = 0;
	for (int ndxA = 0; ndxA < numPrimitivesPerPatch; ++ndxA)
	{
		const tcu::Vec4 (&coordsA)[3] = primitivesA[ndxA].tessCoord;
		bool match = false;

		// Actually both sets are usually somewhat sorted, so don't reset ndxB after each match. Instead, continue from the next index.
		for (int i = 0; i < numPrimitivesPerPatch; ++i)
		{
			const tcu::Vec4 (&coordsB)[3] = primitivesB[ndxB].tessCoord;
			ndxB = (ndxB + 1) % numPrimitivesPerPatch;

			if (coordsA[0] == coordsB[0] && coordsA[1] == coordsB[1] && coordsA[2] == coordsB[2])
			{
				match = true;
				break;
			}
		}

		if (!match)
			return false;
	}
	return true;
}